

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O1

void AlphaVectorPlanning::ExportBeliefSet(BeliefSet *B,string *filename)

{
  JointBeliefInterface *pJVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  uint s;
  int iVar7;
  ulong uVar8;
  double dVar9;
  ofstream fp;
  stringstream ss;
  long local_3d8;
  long local_3d0;
  long local_3b8;
  filebuf local_3b0 [24];
  byte abStack_398 [216];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::ofstream::ofstream(&local_3b8,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_398[*(long *)(local_3b8 + -0x18)] & 5) == 0) {
    uVar4 = (long)(B->
                  super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(B->
                  super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(uVar4 >> 3) != 0) {
      uVar8 = 0;
      do {
        iVar7 = 0;
        while( true ) {
          pJVar1 = (B->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar8];
          iVar3 = (**(code **)(*(long *)((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8)
                                        ) + 0x70))
                            ((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8));
          if (iVar7 == iVar3) break;
          pJVar1 = (B->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar8];
          dVar9 = (double)(**(code **)(*(long *)((long)&pJVar1->field_0x0 +
                                                *(long *)((long)*pJVar1 + -0xb8)) + 0x48))
                                    ((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8),
                                     iVar7);
          poVar5 = std::ostream::_M_insert<double>(dVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          iVar7 = iVar7 + 1;
        }
        cVar2 = (char)&local_3b8;
        std::ios::widen((char)*(undefined8 *)(local_3b8 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uVar4 >> 3 & 0xffffffff));
    }
    local_3b8 = _VTT;
    *(undefined8 *)(local_3b0 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
    std::filebuf::~filebuf(local_3b0);
    std::ios_base::~ios_base(local_2c0);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"AlphaVectorPlanning::ExportBeliefSet: failed to open file ",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar6 = &PTR__E_0059bd80;
  puVar6[1] = puVar6 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar6 + 1),local_3d8,local_3d0 + local_3d8);
  __cxa_throw(puVar6,&E::typeinfo,E::~E);
}

Assistant:

void AlphaVectorPlanning::ExportBeliefSet(const BeliefSet &B,
                                          const string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "AlphaVectorPlanning::ExportBeliefSet: failed to open file "
           << filename;
        throw(E(ss.str()));
    }

    int nrB=B.size();
    for(int b=0;b!=nrB;b++)
    {
        for(unsigned int s=0;s!=B[b]->Size();s++)
            fp << B[b]->Get(s) << " ";
        fp << endl;
    }
}